

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::VertexTextureTests::init(VertexTextureTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TestCaseGroup *this_00;
  TestCaseGroup *this_01;
  TestCaseGroup *this_02;
  TestCaseGroup *this_03;
  TestCaseGroup *this_04;
  TestCaseGroup *this_05;
  ulong extraout_RAX;
  Vertex2DTextureCase *pVVar2;
  char *pcVar3;
  ulong uVar4;
  VertexCubeTextureCase *pVVar5;
  allocator<char> local_311;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 local_2b0 [8];
  string name_3;
  uint local_288;
  int wrapTMode_1;
  int wrapSMode_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  undefined1 local_1e0 [8];
  string name_2;
  int wrapMode_1;
  int magFilter_1;
  int minFilter_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 local_150 [8];
  string name_1;
  uint local_128;
  int wrapTMode;
  int wrapSMode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string name;
  int local_58;
  int wrapMode;
  int magFilter;
  int minFilter;
  TestCaseGroup *wrapGroupCube;
  TestCaseGroup *filteringGroupCube;
  TestCaseGroup *wrapGroup2D;
  TestCaseGroup *filteringGroup2D;
  TestCaseGroup *groupCube;
  TestCaseGroup *group2D;
  VertexTextureTests *this_local;
  
  this_00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_00,(this->super_TestCaseGroup).m_context,"2d","2D Vertex Texture Tests");
  this_01 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_01,(this->super_TestCaseGroup).m_context,"cube","Cube Map Vertex Texture Tests");
  this_02 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_02,(this->super_TestCaseGroup).m_context,"filtering",
             "2D Vertex Texture Filtering Tests");
  this_03 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_03,(this->super_TestCaseGroup).m_context,"wrap","2D Vertex Texture Wrap Tests");
  this_04 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_04,(this->super_TestCaseGroup).m_context,"filtering",
             "Cube Map Vertex Texture Filtering Tests");
  this_05 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_05,(this->super_TestCaseGroup).m_context,"wrap",
             "Cube Map Vertex Texture Wrap Tests");
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)this_02);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)this_03);
  tcu::TestNode::addChild((TestNode *)this_01,(TestNode *)this_04);
  tcu::TestNode::addChild((TestNode *)this_01,(TestNode *)this_05);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  wrapMode = 0;
  uVar4 = extraout_RAX;
  while (wrapMode < 6) {
    for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
      for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 3;
          name.field_2._12_4_ = name.field_2._12_4_ + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&wrapSMode,"",(allocator<char> *)((long)&wrapTMode + 3));
        std::operator+(&local_100,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &wrapSMode,init::minFilterModes[wrapMode].name);
        std::operator+(&local_e0,&local_100,"_");
        std::operator+(&local_c0,&local_e0,init::magFilterModes[local_58].name);
        std::operator+(&local_a0,&local_c0,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                       ,&local_a0,init::wrapModes[(int)name.field_2._12_4_].name);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&wrapSMode);
        std::allocator<char>::~allocator((allocator<char> *)((long)&wrapTMode + 3));
        pVVar2 = (Vertex2DTextureCase *)operator_new(0xa0);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        Vertex2DTextureCase::Vertex2DTextureCase
                  (pVVar2,pCVar1,pcVar3,"",init::minFilterModes[wrapMode].mode,
                   init::magFilterModes[local_58].mode,
                   init::wrapModes[(int)name.field_2._12_4_].mode,
                   init::wrapModes[(int)name.field_2._12_4_].mode);
        tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pVVar2);
        std::__cxx11::string::~string((string *)local_80);
      }
    }
    wrapMode = wrapMode + 1;
    uVar4 = (ulong)(uint)wrapMode;
  }
  local_128 = 0;
  while ((int)local_128 < 3) {
    for (name_1.field_2._12_4_ = 0; (int)name_1.field_2._12_4_ < 3;
        name_1.field_2._12_4_ = name_1.field_2._12_4_ + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&minFilter_1,"",(allocator<char> *)((long)&magFilter_1 + 3));
      std::operator+(&local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &minFilter_1,init::wrapModes[(int)local_128].name);
      std::operator+(&local_170,&local_190,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                     &local_170,init::wrapModes[(int)name_1.field_2._12_4_].name);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&minFilter_1);
      std::allocator<char>::~allocator((allocator<char> *)((long)&magFilter_1 + 3));
      pVVar2 = (Vertex2DTextureCase *)operator_new(0xa0);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      Vertex2DTextureCase::Vertex2DTextureCase
                (pVVar2,pCVar1,pcVar3,"",0x2703,0x2601,init::wrapModes[(int)local_128].mode,
                 init::wrapModes[(int)name_1.field_2._12_4_].mode);
      tcu::TestNode::addChild((TestNode *)this_03,(TestNode *)pVVar2);
      std::__cxx11::string::~string((string *)local_150);
    }
    local_128 = local_128 + 1;
    uVar4 = (ulong)local_128;
  }
  wrapMode_1 = 0;
  while (wrapMode_1 < 6) {
    for (name_2.field_2._12_4_ = 0; (int)name_2.field_2._12_4_ < 2;
        name_2.field_2._12_4_ = name_2.field_2._12_4_ + 1) {
      for (name_2.field_2._8_4_ = 0; (int)name_2.field_2._8_4_ < 3;
          name_2.field_2._8_4_ = name_2.field_2._8_4_ + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&wrapSMode_1,"",(allocator<char> *)((long)&wrapTMode_1 + 3));
        std::operator+(&local_260,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &wrapSMode_1,init::minFilterModes[wrapMode_1].name);
        std::operator+(&local_240,&local_260,"_");
        std::operator+(&local_220,&local_240,init::magFilterModes[(int)name_2.field_2._12_4_].name);
        std::operator+(&local_200,&local_220,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1e0,&local_200,init::wrapModes[(int)name_2.field_2._8_4_].name);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&wrapSMode_1);
        std::allocator<char>::~allocator((allocator<char> *)((long)&wrapTMode_1 + 3));
        pVVar5 = (VertexCubeTextureCase *)operator_new(0xa0);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        VertexCubeTextureCase::VertexCubeTextureCase
                  (pVVar5,pCVar1,pcVar3,"",init::minFilterModes[wrapMode_1].mode,
                   init::magFilterModes[(int)name_2.field_2._12_4_].mode,
                   init::wrapModes[(int)name_2.field_2._8_4_].mode,
                   init::wrapModes[(int)name_2.field_2._8_4_].mode);
        tcu::TestNode::addChild((TestNode *)this_04,(TestNode *)pVVar5);
        std::__cxx11::string::~string((string *)local_1e0);
      }
    }
    wrapMode_1 = wrapMode_1 + 1;
    uVar4 = (ulong)(uint)wrapMode_1;
  }
  local_288 = 0;
  while ((int)local_288 < 3) {
    for (name_3.field_2._12_4_ = 0; (int)name_3.field_2._12_4_ < 3;
        name_3.field_2._12_4_ = name_3.field_2._12_4_ + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"",&local_311);
      std::operator+(&local_2f0,&local_310,init::wrapModes[(int)local_288].name);
      std::operator+(&local_2d0,&local_2f0,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                     &local_2d0,init::wrapModes[(int)name_3.field_2._12_4_].name);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      std::allocator<char>::~allocator(&local_311);
      pVVar5 = (VertexCubeTextureCase *)operator_new(0xa0);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      VertexCubeTextureCase::VertexCubeTextureCase
                (pVVar5,pCVar1,pcVar3,"",0x2703,0x2601,init::wrapModes[(int)local_288].mode,
                 init::wrapModes[(int)name_3.field_2._12_4_].mode);
      tcu::TestNode::addChild((TestNode *)this_05,(TestNode *)pVVar5);
      std::__cxx11::string::~string((string *)local_2b0);
    }
    local_288 = local_288 + 1;
    uVar4 = (ulong)local_288;
  }
  return (int)uVar4;
}

Assistant:

void VertexTextureTests::init (void)
{
	// 2D and cube map groups, and their filtering and wrap sub-groups.
	TestCaseGroup* const group2D				= new TestCaseGroup(m_context, "2d",			"2D Vertex Texture Tests");
	TestCaseGroup* const groupCube				= new TestCaseGroup(m_context, "cube",			"Cube Map Vertex Texture Tests");
	TestCaseGroup* const filteringGroup2D		= new TestCaseGroup(m_context, "filtering",		"2D Vertex Texture Filtering Tests");
	TestCaseGroup* const wrapGroup2D			= new TestCaseGroup(m_context, "wrap",			"2D Vertex Texture Wrap Tests");
	TestCaseGroup* const filteringGroupCube		= new TestCaseGroup(m_context, "filtering",		"Cube Map Vertex Texture Filtering Tests");
	TestCaseGroup* const wrapGroupCube			= new TestCaseGroup(m_context, "wrap",			"Cube Map Vertex Texture Wrap Tests");

	group2D->addChild(filteringGroup2D);
	group2D->addChild(wrapGroup2D);
	groupCube->addChild(filteringGroupCube);
	groupCube->addChild(wrapGroupCube);

	addChild(group2D);
	addChild(groupCube);

	static const struct
	{
		const char*		name;
		GLenum			mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE	},
		{ "repeat",		GL_REPEAT			},
		{ "mirror",		GL_MIRRORED_REPEAT	}
	};

	static const struct
	{
		const char*		name;
		GLenum			mode;
	} minFilterModes[] =
	{
		{ "nearest",				GL_NEAREST					},
		{ "linear",					GL_LINEAR					},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		const char*		name;
		GLenum			mode;
	} magFilterModes[] =
	{
		{ "nearest",	GL_NEAREST	},
		{ "linear",		GL_LINEAR	}
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	// 2D cases.

	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
		{
			const string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name;

			filteringGroup2D->addChild(new Vertex2DTextureCase(m_context,
															   name.c_str(), "",
															   minFilterModes[minFilter].mode,
															   magFilterModes[magFilter].mode,
															   wrapModes[wrapMode].mode,
															   wrapModes[wrapMode].mode));
		})));

	FOR_EACH(wrapSMode,		wrapModes,
	FOR_EACH(wrapTMode,		wrapModes,
		{
			const string name = string("") + wrapModes[wrapSMode].name + "_" + wrapModes[wrapTMode].name;

			wrapGroup2D->addChild(new Vertex2DTextureCase(m_context,
														  name.c_str(), "",
														  GL_LINEAR_MIPMAP_LINEAR,
														  GL_LINEAR,
														  wrapModes[wrapSMode].mode,
														  wrapModes[wrapTMode].mode));
		}));

	// Cube map cases.

	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
		{
			const string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name;

			filteringGroupCube->addChild(new VertexCubeTextureCase(m_context,
																   name.c_str(), "",
																   minFilterModes[minFilter].mode,
																   magFilterModes[magFilter].mode,
																   wrapModes[wrapMode].mode,
																   wrapModes[wrapMode].mode));
		})));

	FOR_EACH(wrapSMode,		wrapModes,
	FOR_EACH(wrapTMode,		wrapModes,
		{
			const string name = string("") + wrapModes[wrapSMode].name + "_" + wrapModes[wrapTMode].name;

			wrapGroupCube->addChild(new VertexCubeTextureCase(m_context,
															  name.c_str(), "",
															  GL_LINEAR_MIPMAP_LINEAR,
															  GL_LINEAR,
															  wrapModes[wrapSMode].mode,
															  wrapModes[wrapTMode].mode));
		}));
}